

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int lyp_deviate_apply_ext(lys_deviate *dev,lys_node *target,LYEXT_SUBSTMT substmt,lys_ext *extdef)

{
  lys_ext_instance ***ext;
  uint8_t *size;
  uint8_t uVar1;
  ly_ctx *ctx;
  lys_ext_instance *plVar2;
  int iVar3;
  int iVar4;
  lys_ext_instance *plVar5;
  lys_ext_instance **pplVar6;
  char *pcVar7;
  long lVar8;
  
  ctx = target->module->ctx;
  ext = &target->ext;
  size = &target->ext_size;
  iVar3 = -1;
  iVar4 = -1;
  do {
    pplVar6 = dev->ext;
    do {
      iVar3 = lys_ext_iter(pplVar6,dev->ext_size,(char)iVar3 + '\x01',substmt);
      if (iVar3 == -1) {
        iVar4 = lys_ext_iter(*ext,*size,(char)iVar4 + '\x01',substmt);
        if (iVar4 == -1) {
          return 0;
        }
        goto LAB_00129712;
      }
      if (substmt != LYEXT_SUBSTMT_SELF) goto LAB_0012950f;
      pplVar6 = dev->ext;
    } while (pplVar6[iVar3]->def != extdef);
    if (dev->mod == LY_DEVIATE_ADD) {
      for (iVar4 = lys_ext_iter(*ext,*size,(char)iVar4 + '\x01',LYEXT_SUBSTMT_SELF); iVar4 != -1;
          iVar4 = lys_ext_iter(*ext,*size,(char)iVar4 + '\x01',LYEXT_SUBSTMT_SELF)) {
        lVar8 = (long)iVar4;
        plVar5 = (*ext)[lVar8];
        if ((plVar5->def == extdef) && ((plVar5->flags & 1) != 0)) goto LAB_00129566;
      }
LAB_001295c4:
      plVar5 = (lys_ext_instance *)malloc(0x40);
      if (plVar5 == (lys_ext_instance *)0x0) {
LAB_0012978e:
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_deviate_apply_ext");
        return 1;
      }
      pplVar6 = (lys_ext_instance **)realloc(*ext,(ulong)*size * 8 + 8);
      if (pplVar6 == (lys_ext_instance **)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_deviate_apply_ext");
        free(plVar5);
        return 1;
      }
      *ext = pplVar6;
      uVar1 = *size;
      *size = uVar1 + 1;
      iVar4 = (byte)(uVar1 + 1) - 1;
    }
    else {
LAB_0012950f:
      pplVar6 = *ext;
      do {
        iVar4 = lys_ext_iter(pplVar6,*size,(char)iVar4 + '\x01',substmt);
        if ((substmt != LYEXT_SUBSTMT_SELF) || (iVar4 == -1)) {
          if (iVar4 == -1) goto LAB_001295c4;
          lVar8 = (long)iVar4;
          plVar5 = (*ext)[lVar8];
          break;
        }
        pplVar6 = *ext;
        lVar8 = (long)iVar4;
        plVar5 = pplVar6[lVar8];
      } while (plVar5->def != extdef);
LAB_00129566:
      lys_extension_instances_free
                (ctx,plVar5->ext,(uint)plVar5->ext_size,(_func_void_lys_node_ptr_void_ptr *)0x0);
      lydict_remove(ctx,(*ext)[lVar8]->arg_value);
      free((*ext)[lVar8]);
      plVar5 = (lys_ext_instance *)malloc(0x40);
      if (plVar5 == (lys_ext_instance *)0x0) goto LAB_0012978e;
      pplVar6 = *ext;
    }
    pplVar6[iVar4] = plVar5;
    pplVar6 = dev->ext;
    target->ext[iVar4]->def = pplVar6[iVar3]->def;
    pcVar7 = lydict_insert(ctx,pplVar6[iVar3]->arg_value,0);
    pplVar6 = target->ext;
    pplVar6[iVar4]->arg_value = pcVar7;
    plVar5 = pplVar6[iVar4];
    plVar5->flags = 0;
    plVar5->parent = target;
    plVar5 = pplVar6[iVar4];
    plVar5->parent_type = '\x01';
    plVar5->insubstmt = (uint8_t)substmt;
    plVar2 = dev->ext[iVar3];
    plVar5->insubstmt_index = plVar2->insubstmt_index;
    uVar1 = plVar2->ext_size;
    plVar5->ext_size = uVar1;
    lys_ext_dup(ctx,target->module,plVar2->ext,uVar1,target,LYEXT_PAR_NODE,&plVar5->ext,1,
                (unres_schema *)0x0);
    pplVar6 = target->ext;
    plVar5 = pplVar6[iVar4];
    plVar5->nodetype = LYS_EXT;
    plVar5->module = target->module;
    pplVar6[iVar4]->priv = (void *)0x0;
  } while( true );
LAB_00129712:
  if (substmt == LYEXT_SUBSTMT_SELF) {
    pplVar6 = *ext;
    if ((pplVar6[iVar4]->def == extdef) &&
       ((dev->mod != LY_DEVIATE_ADD || ((pplVar6[iVar4]->flags & 1) != 0)))) goto LAB_00129717;
  }
  else {
LAB_00129717:
    lyp_ext_instance_rm(ctx,ext,size,(uint8_t)iVar4);
    iVar4 = iVar4 + -1;
    pplVar6 = *ext;
  }
  iVar4 = lys_ext_iter(pplVar6,*size,(char)iVar4 + '\x01',substmt);
  if (iVar4 == -1) {
    return 0;
  }
  goto LAB_00129712;
}

Assistant:

static int
lyp_deviate_apply_ext(struct lys_deviate *dev, struct lys_node *target, LYEXT_SUBSTMT substmt, struct lys_ext *extdef)
{
    struct ly_ctx *ctx;
    int m, n;
    struct lys_ext_instance *new;
    void *reallocated;

    /* LY_DEVIATE_ADD and LY_DEVIATE_RPL are very similar so they are implement the same way - in replacing,
     * there can be some extension instances in the target, in case of adding, there should not be any so we
     * will be just adding. */

    ctx = target->module->ctx; /* shortcut */
    m = n = -1;

    while ((m = lys_ext_iter(dev->ext, dev->ext_size, m + 1, substmt)) != -1) {
        /* deviate and its substatements include extensions, copy them to the target, replacing the previous
         * extensions if any. In case of deviating extension itself, we have to deviate only the same type
         * of the extension as specified in the deviation */
        if (substmt == LYEXT_SUBSTMT_SELF && dev->ext[m]->def != extdef) {
            continue;
        }

        if (substmt == LYEXT_SUBSTMT_SELF && dev->mod == LY_DEVIATE_ADD) {
            /* in case of adding extension, we will be replacing only the inherited extensions */
            do {
                n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt);
            } while (n != -1 && (target->ext[n]->def != extdef || !(target->ext[n]->flags & LYEXT_OPT_INHERIT)));
        } else {
            /* get the index of the extension to replace in the target node */
            do {
                n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt);
                /* if we are applying extension deviation, we have to deviate only the same type of the extension */
            } while (n != -1 && substmt == LYEXT_SUBSTMT_SELF && target->ext[n]->def != extdef);
        }

        if (n == -1) {
            /* nothing to replace, we are going to add it - reallocate */
            new = malloc(sizeof **target->ext);
            LY_CHECK_ERR_RETURN(!new, LOGMEM(ctx), EXIT_FAILURE);
            reallocated = realloc(target->ext, (target->ext_size + 1) * sizeof *target->ext);
            LY_CHECK_ERR_RETURN(!reallocated, LOGMEM(ctx); free(new), EXIT_FAILURE);
            target->ext = reallocated;
            target->ext_size++;

            n = target->ext_size - 1;
        } else {
            /* replacing - the original set of extensions is actually backuped together with the
             * node itself, so we are supposed only to free the allocated data here ... */
            lys_extension_instances_free(ctx, target->ext[n]->ext, target->ext[n]->ext_size, NULL);
            lydict_remove(ctx, target->ext[n]->arg_value);
            free(target->ext[n]);

            /* and prepare the new structure */
            new = malloc(sizeof **target->ext);
            LY_CHECK_ERR_RETURN(!new, LOGMEM(ctx), EXIT_FAILURE);
        }
        /* common part for adding and replacing - fill the newly created / replaced cell */
        target->ext[n] = new;
        target->ext[n]->def = dev->ext[m]->def;
        target->ext[n]->arg_value = lydict_insert(ctx, dev->ext[m]->arg_value, 0);
        target->ext[n]->flags = 0;
        target->ext[n]->parent = target;
        target->ext[n]->parent_type = LYEXT_PAR_NODE;
        target->ext[n]->insubstmt = substmt;
        target->ext[n]->insubstmt_index = dev->ext[m]->insubstmt_index;
        target->ext[n]->ext_size = dev->ext[m]->ext_size;
        lys_ext_dup(ctx, target->module, dev->ext[m]->ext, dev->ext[m]->ext_size, target, LYEXT_PAR_NODE,
                    &target->ext[n]->ext, 1, NULL);
        target->ext[n]->nodetype = LYS_EXT;
        target->ext[n]->module = target->module;
        target->ext[n]->priv = NULL;

        /* TODO cover complex extension instances */
    }

    /* remove the rest of extensions belonging to the original substatement in the target node,
     * due to possible reverting of the deviation effect, they are actually not removed, just moved
     * to the backup of the original node when the original node is backuped, here we just have to
     * free the replaced / deleted originals */
    while ((n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt)) != -1) {
        if (substmt == LYEXT_SUBSTMT_SELF) {
            /* if we are applying extension deviation, we are going to remove only
             * - the same type of the extension in case of replacing
             * - the same type of the extension which was inherited in case of adding
             * note - delete deviation is covered in lyp_deviate_del_ext */
            if (target->ext[n]->def != extdef ||
                    (dev->mod == LY_DEVIATE_ADD && !(target->ext[n]->flags & LYEXT_OPT_INHERIT))) {
                /* keep this extension */
                continue;
            }

        }

        /* remove the item */
        lyp_ext_instance_rm(ctx, &target->ext, &target->ext_size, n);
        --n;
    }

    return EXIT_SUCCESS;
}